

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.h
# Opt level: O0

void __thiscall cppcms::impl::sha1::reset(sha1 *this)

{
  sha1 *this_local;
  
  this->h_[0] = 0x67452301;
  this->h_[1] = 0xefcdab89;
  this->h_[2] = 0x98badcfe;
  this->h_[3] = 0x10325476;
  this->h_[4] = 0xc3d2e1f0;
  this->block_byte_index_ = 0;
  this->byte_count_ = 0;
  return;
}

Assistant:

inline void sha1::reset()
{
    h_[0] = 0x67452301;
    h_[1] = 0xEFCDAB89;
    h_[2] = 0x98BADCFE;
    h_[3] = 0x10325476;
    h_[4] = 0xC3D2E1F0;

    block_byte_index_ = 0;
    byte_count_ = 0;
}